

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  long *plVar1;
  CodeBuffer *cb;
  OffsetFormat OVar2;
  long lVar3;
  OffsetFormat OVar4;
  ZoneHashNode ZVar5;
  bool bVar6;
  undefined1 uVar7;
  Error EVar8;
  uint uVar9;
  int iVar10;
  LabelEntry *pLVar11;
  ZoneAllocator *pZVar12;
  size_t *psVar13;
  size_t *psVar14;
  uint *puVar15;
  ExpressionValueType *pEVar16;
  Value VVar17;
  ulong uVar18;
  Value VVar19;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ZoneHashNode *name;
  long lVar20;
  ulong uVar21;
  ExpressionValueType *pEVar22;
  Section *pSVar23;
  uint uVar24;
  OffsetFormat *pOVar25;
  OffsetFormat *pOVar26;
  ulong uVar27;
  ZoneHashNode *pZVar28;
  ZoneHashNode *zone;
  Value self;
  CodeHolder *pCVar29;
  ZoneHashNode *pZVar30;
  ZoneHashNode *dst;
  ZoneAllocator *pZVar31;
  CodeHolder *self_00;
  uint in_R8D;
  ulong in_R9;
  CodeHolder *pCVar32;
  long lVar33;
  undefined8 *puVar34;
  OffsetFormat *format;
  Value *pVVar35;
  size_t *psVar36;
  bool bVar37;
  Value aVStack_210 [2];
  Value VStack_200;
  Value VStack_1f8;
  Value VStack_1f0;
  Section *pSStack_1e8;
  CodeHolder *pCStack_1e0;
  OffsetFormat *pOStack_1d8;
  CodeHolder *pCStack_1d0;
  Value VStack_1c8;
  code *pcStack_1c0;
  Arch AStack_1b1;
  ulong uStack_1b0;
  Section *pSStack_1a8;
  Value VStack_1a0;
  uint8_t *puStack_198;
  Value VStack_190;
  ulong uStack_188;
  ZoneHashNode *pZStack_180;
  CodeHolder *pCStack_178;
  OffsetFormat *pOStack_170;
  ZoneHashNode *pZStack_168;
  ZoneAllocator *pZStack_160;
  ulong uStack_158;
  undefined8 uStack_150;
  size_t sStack_140;
  ZoneHashNode *pZStack_138;
  size_t *psStack_130;
  ZoneHashNode *pZStack_128;
  long lStack_120;
  ulong uStack_118;
  Error EStack_104;
  long lStack_100;
  ZoneHashNode *pZStack_f8;
  size_t *psStack_f0;
  OffsetFormat *pOStack_e8;
  CodeHolder *pCStack_e0;
  size_t *psStack_d8;
  OffsetFormat *pOStack_d0;
  long *plStack_c8;
  long *plStack_c0;
  ZoneHashNode *pZStack_b8;
  ZoneAllocator *pZStack_b0;
  ulong uStack_a8;
  ZoneHashNode *pZStack_a0;
  CodeHolder *pCStack_98;
  OffsetFormat *pOStack_88;
  ZoneHashNode ZStack_80;
  uint uStack_7c;
  ZoneAllocator *pZStack_78;
  ZoneHashNode *pZStack_70;
  size_t sStack_68;
  ulong uStack_60;
  LabelEntry **ppLStack_58;
  size_t sStack_28;
  
  *entryOut = (LabelEntry *)0x0;
  iVar10 = *(int *)&this->field_0x100;
  if (iVar10 == -1) {
    return 0xd;
  }
  pCVar29 = (CodeHolder *)&this->_allocator;
  if ((*(int *)&this->field_0x104 == iVar10) &&
     (EVar8 = ZoneVectorBase::_grow
                        ((ZoneVectorBase *)&this->_labelEntries,(ZoneAllocator *)pCVar29,8,1),
     EVar8 != 0)) {
    return EVar8;
  }
  if (*(long *)&((ZoneAllocator *)pCVar29)->field_0x0 == 0) {
    newLabelEntry();
    return 1;
  }
  pZVar28 = (ZoneHashNode *)0x40;
  pLVar11 = (LabelEntry *)ZoneAllocator::_allocZeroed((ZoneAllocator *)pCVar29,0x40,&sStack_28);
  if (pLVar11 == (LabelEntry *)0x0) {
    return 1;
  }
  *(int *)&pLVar11->field_0xc = iVar10;
  pLVar11->_parentId = 0xffffffff;
  pLVar11->_offset = 0;
  uVar21 = (ulong)*(uint *)&this->field_0x100;
  if (*(uint *)&this->field_0x100 < *(uint *)&this->field_0x104) {
    *(LabelEntry **)(*(long *)&this->_labelEntries + uVar21 * 8) = pLVar11;
    *(int *)&this->field_0x100 = *(int *)&this->field_0x100 + 1;
    *entryOut = pLVar11;
    return 0;
  }
  newLabelEntry();
  pOVar25 = (OffsetFormat *)(in_R9 & 0xffffffff);
  ZVar5 = SUB41(in_R8D,0);
  zone = (ZoneHashNode *)&uStack_60;
  *(undefined8 *)pZVar28 = 0;
  pOStack_88 = (OffsetFormat *)0x1187ba;
  pZVar30 = name;
  uStack_60 = uVar21;
  ppLStack_58 = entryOut;
  uVar9 = CodeHolder_hashNameAndGetSize((char *)name,(size_t *)zone);
  uVar21 = uStack_60;
  if (uStack_60 == 0) {
    if (ZVar5 == (ZoneHashNode)0x0) {
      EVar8 = newLabelEntry(pCVar29,(LabelEntry **)pZVar28);
      return EVar8;
    }
    return 0x11;
  }
  if (0x800 < uStack_60) {
    return 0x10;
  }
  in_R8D = in_R8D & 0xff;
  uVar24 = (uint)in_R9;
  if (in_R8D - 2 < 2) {
    if (uVar24 != 0xffffffff) {
      return 0x12;
    }
LAB_001188e5:
    uStack_7c = uVar9;
    pZStack_70 = pZVar28;
    for (puVar34 = *(undefined8 **)
                    (*(long *)&pCVar29->_namedLabels +
                    (ulong)(uVar9 - (int)((ulong)*(uint *)&pCVar29->field_0x130 * (ulong)uVar9 >>
                                         (pCVar29->field_0x134 & 0x3f)) *
                                    *(int *)&pCVar29->field_0x128) * 8);
        puVar34 != (undefined8 *)0x0; puVar34 = (undefined8 *)*puVar34) {
      if ((*(int *)(puVar34 + 6) == (int)uVar21) && (*(uint *)((long)puVar34 + 0x14) == uVar24)) {
        if (uVar21 < 0xc) {
          pZVar30 = (ZoneHashNode *)((long)puVar34 + 0x34);
        }
        else {
          pZVar30 = (ZoneHashNode *)puVar34[7];
        }
        pOStack_88 = (OffsetFormat *)0x118946;
        zone = name;
        iVar10 = bcmp(pZVar30,name,uVar21);
        if (iVar10 == 0) {
          return 0xf;
        }
      }
    }
    uVar9 = *(uint *)&pCVar29->field_0x100;
    pZVar12 = (ZoneAllocator *)(ulong)uVar9;
    if (uVar9 == 0xffffffff) {
      return 0xd;
    }
    pZVar28 = (ZoneHashNode *)&pCVar29->_allocator;
    ZStack_80 = ZVar5;
    if (*(uint *)&pCVar29->field_0x104 == uVar9) {
      pZVar30 = (ZoneHashNode *)&pCVar29->_labelEntries;
      pOStack_88 = (OffsetFormat *)0x11898d;
      zone = pZVar28;
      EVar8 = ZoneVectorBase::_grow((ZoneVectorBase *)pZVar30,(ZoneAllocator *)pZVar28,8,1);
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    if (*(long *)pZVar28 == 0) {
      pOStack_88 = (OffsetFormat *)0x118a9e;
      newNamedLabelEntry();
      goto LAB_00118a9e;
    }
    pOStack_88 = (OffsetFormat *)0x1189b7;
    pZStack_78 = (ZoneAllocator *)pZVar28;
    pZVar28 = (ZoneHashNode *)ZoneAllocator::_allocZeroed((ZoneAllocator *)pZVar28,0x40,&sStack_68);
    if (pZVar28 == (ZoneHashNode *)0x0) {
      return 1;
    }
    *(uint *)(pZVar28 + 8) = uStack_7c;
    *(uint *)(pZVar28 + 0xc) = uVar9;
    pZVar28[0x10] = ZStack_80;
    *(uint *)(pZVar28 + 0x14) = uVar24;
    *(undefined8 *)(pZVar28 + 0x18) = 0;
    pZVar30 = pZVar28 + 0x30;
    zone = (ZoneHashNode *)&pCVar29->_zone;
    pOStack_88 = (OffsetFormat *)0x1189fd;
    EVar8 = ZoneStringBase::setData((ZoneStringBase *)pZVar30,(Zone *)zone,0xb,(char *)name,uVar21);
    if (EVar8 != 0) {
      return EVar8;
    }
    if (*(uint *)&pCVar29->field_0x100 < *(uint *)&pCVar29->field_0x104) {
      *(ZoneHashNode **)
       (*(long *)&pCVar29->_labelEntries + (ulong)*(uint *)&pCVar29->field_0x100 * 8) = pZVar28;
      *(int *)&pCVar29->field_0x100 = *(int *)&pCVar29->field_0x100 + 1;
      pOStack_88 = (OffsetFormat *)0x118a3b;
      ZoneHashBase::_insert((ZoneHashBase *)&pCVar29->_namedLabels,pZStack_78,pZVar28);
      *(ZoneHashNode **)pZStack_70 = pZVar28;
      return 0;
    }
  }
  else {
    if (in_R8D == 1) {
      if (*(uint *)&pCVar29->field_0x100 <= uVar24) {
        return 0x12;
      }
      uVar9 = uVar9 ^ uVar24;
      goto LAB_001188e5;
    }
    if (in_R8D != 0) {
      return 2;
    }
    if (uVar24 != 0xffffffff) {
      return 0x12;
    }
    uVar9 = *(uint *)&pCVar29->field_0x100;
    pOVar25 = (OffsetFormat *)(ulong)uVar9;
    if (uVar9 == 0xffffffff) {
      return 0xd;
    }
    pZVar12 = &pCVar29->_allocator;
    if (*(uint *)&pCVar29->field_0x104 == uVar9) {
      pZVar30 = (ZoneHashNode *)&pCVar29->_labelEntries;
      pOStack_88 = (OffsetFormat *)0x118838;
      zone = (ZoneHashNode *)pZVar12;
      EVar8 = ZoneVectorBase::_grow((ZoneVectorBase *)pZVar30,pZVar12,8,1);
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    if (*(long *)pZVar12 != 0) {
      pOStack_88 = (OffsetFormat *)0x11885c;
      pZVar12 = (ZoneAllocator *)ZoneAllocator::_allocZeroed(pZVar12,0x40,&sStack_68);
      if (pZVar12 == (ZoneAllocator *)0x0) {
        return 1;
      }
      *(uint *)(pZVar12 + 0xc) = uVar9;
      *(undefined4 *)(pZVar12 + 0x14) = 0xffffffff;
      *(undefined8 *)(pZVar12 + 0x18) = 0;
      pZVar30 = (ZoneHashNode *)(pZVar12 + 0x30);
      zone = (ZoneHashNode *)&pCVar29->_zone;
      pOStack_88 = (OffsetFormat *)0x118895;
      EVar8 = ZoneStringBase::setData
                        ((ZoneStringBase *)pZVar30,(Zone *)zone,0xb,(char *)name,uVar21);
      if (EVar8 != 0) {
        return EVar8;
      }
      if (*(uint *)&pCVar29->field_0x100 < *(uint *)&pCVar29->field_0x104) {
        *(ZoneAllocator **)
         (*(long *)&pCVar29->_labelEntries + (ulong)*(uint *)&pCVar29->field_0x100 * 8) = pZVar12;
        *(int *)&pCVar29->field_0x100 = *(int *)&pCVar29->field_0x100 + 1;
        *(ZoneAllocator **)pZVar28 = pZVar12;
        return 0;
      }
      goto LAB_00118aa8;
    }
LAB_00118a9e:
    pOStack_88 = (OffsetFormat *)0x118aa3;
    newNamedLabelEntry();
  }
  pOStack_88 = (OffsetFormat *)0x118aa8;
  newNamedLabelEntry();
LAB_00118aa8:
  pOStack_88 = (OffsetFormat *)0x118aad;
  newNamedLabelEntry();
  uStack_a8 = uVar21;
  format = (OffsetFormat *)0x0;
  if ((*(size_t *)(pZVar30 + 0x140) != 0) && ((ulong)*(uint *)(pZVar30 + 0x100) != 0)) {
    plStack_c0 = *(long **)(pZVar30 + 0xf8);
    plStack_c8 = plStack_c0 + *(uint *)(pZVar30 + 0x100);
    format = (OffsetFormat *)0x0;
    dst = pZVar30;
    pZStack_b0 = pZVar12;
    pZStack_a0 = pZVar28;
    pCStack_98 = pCVar29;
    pOStack_88 = pOVar25;
    do {
      lVar20 = *plStack_c0;
      if ((*(long *)(lVar20 + 0x20) != 0) && (*(size_t **)(lVar20 + 0x28) != (size_t *)0x0)) {
        psVar14 = (size_t *)(lVar20 + 0x28);
        uVar21 = *(ulong *)(*(long *)(lVar20 + 0x20) + 0x10);
        bVar37 = CARRY8(uVar21,*(ulong *)(lVar20 + 0x18));
        pZVar28 = (ZoneHashNode *)(uVar21 + *(ulong *)(lVar20 + 0x18));
        pCVar29 = (CodeHolder *)CONCAT71((int7)((ulong)pCVar29 >> 8),bVar37);
        psVar36 = *(size_t **)(lVar20 + 0x28);
        pZStack_b8 = pZVar28;
        do {
          pOVar26 = format;
          if (*(int *)((long)psVar36 + 0xc) != -1) goto LAB_00118bc5;
          if (*(uint *)(pZVar30 + 0xe0) <= (uint)psVar36[1]) {
            pOStack_d0 = (OffsetFormat *)0x118c04;
            resolveUnresolvedLinks();
LAB_00118c04:
            pOStack_d0 = (OffsetFormat *)0x118c09;
            resolveUnresolvedLinks();
LAB_00118c09:
            pOStack_d0 = (OffsetFormat *)0x118c0e;
            resolveUnresolvedLinks();
LAB_00118c0e:
            pOStack_d0 = (OffsetFormat *)0x118c13;
            resolveUnresolvedLinks();
            EStack_104 = 0xc;
            if (*(uint *)(dst + 0x100) <= *(uint *)(zone + 4)) {
              return 0xc;
            }
            lVar20 = *(long *)(*(size_t *)(dst + 0xf8) + (ulong)*(uint *)(zone + 4) * 8);
            if (lVar20 == 0) {
              return 0xc;
            }
            uVar21 = (ulong)extraout_EDX;
            if (*(uint *)(dst + 0xe0) < extraout_EDX) {
              return 0x13;
            }
            if (*(long *)(lVar20 + 0x20) != 0) {
              return 0xe;
            }
            pZStack_f8 = pZVar30;
            psStack_f0 = psVar14;
            pOStack_e8 = format;
            pCStack_e0 = pCVar29;
            psStack_d8 = psVar36;
            pOStack_d0 = pOVar25;
            if (extraout_EDX < *(uint *)(dst + 0xe0)) {
              lStack_100 = *(long *)(*(size_t *)(dst + 0xd8) + uVar21 * 8);
              *(long *)(lVar20 + 0x20) = lStack_100;
              *(ZoneHashNode **)(lVar20 + 0x18) = pZVar28;
              if (*(size_t **)(lVar20 + 0x28) == (size_t *)0x0) {
                return 0;
              }
              EStack_104 = 0;
              psVar14 = *(size_t **)(lVar20 + 0x28);
              psVar36 = (size_t *)(lVar20 + 0x28);
              goto LAB_00118cb0;
            }
            uStack_118 = 0x118daf;
            pZVar30 = dst;
            bindLabel();
            uVar27 = (ulong)extraout_EDX_00;
            pZVar12 = (ZoneAllocator *)(pZVar30 + 0x68);
            uVar9 = *(uint *)(pZVar30 + 0x110);
            pZStack_138 = pZVar28;
            psStack_130 = psVar14;
            pZStack_128 = dst;
            lStack_120 = lVar20;
            uStack_118 = uVar21;
            if (*(uint *)(pZVar30 + 0x114) == uVar9) {
              uStack_150 = 0x118df1;
              EVar8 = ZoneVectorBase::_grow((ZoneVectorBase *)(pZVar30 + 0x108),pZVar12,8,1);
              if (EVar8 != 0) {
                return EVar8;
              }
              uVar9 = *(uint *)(pZVar30 + 0x110);
            }
            pCVar29 = (CodeHolder *)(ulong)uVar9;
            if (uVar9 == 0xffffffff) {
              EVar8 = 0x16;
            }
            else {
              if (*(long *)pZVar12 == 0) {
                uStack_150 = 0x118e6d;
                newRelocEntry();
              }
              else {
                uStack_150 = 0x118e1a;
                pZVar31 = pZVar12;
                puVar15 = (uint *)ZoneAllocator::_allocZeroed(pZVar12,0x28,&sStack_140);
                if (puVar15 != (uint *)0x0) {
                  *puVar15 = uVar9;
                  puVar15[1] = extraout_EDX_00;
                  puVar15[4] = 0xffffffff;
                  puVar15[5] = 0xffffffff;
                  if (*(uint *)(pZVar30 + 0x110) < *(uint *)(pZVar30 + 0x114)) {
                    *(uint **)(*(size_t *)(pZVar30 + 0x108) + (ulong)*(uint *)(pZVar30 + 0x110) * 8)
                         = puVar15;
                    *(int *)(pZVar30 + 0x110) = *(int *)(pZVar30 + 0x110) + 1;
                    *(uint **)zone = puVar15;
                    return 0;
                  }
                  uStack_150 = 0x118e79;
                  newRelocEntry();
                  if ((ulong)*(uint *)(pZVar31 + 0xf0) == 0) {
                    return 0;
                  }
                  lVar20 = 0;
                  self_00 = (CodeHolder *)0x0;
                  VVar19._0_1_ = kSignedOffset;
                  VVar19._1_1_ = '\0';
                  VVar19._2_1_ = '\0';
                  VVar19._3_1_ = '\0';
                  VVar19._4_1_ = '\0';
                  VVar19._5_1_ = '\0';
                  VVar19._6_1_ = '\0';
                  VVar19._7_1_ = '\0';
                  goto LAB_00118e97;
                }
              }
              EVar8 = 1;
            }
            return EVar8;
          }
          pZVar28 = *(ZoneHashNode **)(pZVar30 + 0xd8);
          lVar20 = *(long *)(pZVar28 + (ulong)(uint)psVar36[1] * 8);
          dst = (ZoneHashNode *)psVar36[2];
          if (*(ZoneHashNode **)(lVar20 + 0x50) <= dst) goto LAB_00118c04;
          uVar21 = *(ulong *)(lVar20 + 0x10);
          pZVar28 = dst + uVar21;
          zone = (ZoneHashNode *)
                 CONCAT71((int7)((ulong)zone >> 8),CARRY8(uVar21,(ulong)dst) || bVar37);
          pOVar25 = (OffsetFormat *)0x30;
          pOVar26 = pOVar25;
          if (!CARRY8(uVar21,(ulong)dst) && !bVar37) {
            zone = (ZoneHashNode *)(ulong)*(byte *)((long)psVar36 + 0x23);
            if (*(ZoneHashNode **)(lVar20 + 0x50) + -(long)dst < zone) goto LAB_00118c09;
            zone = pZStack_b8 + (psVar36[3] - (long)pZVar28);
            dst = dst + *(long *)(lVar20 + 0x48);
            pOStack_d0 = (OffsetFormat *)0x118b9f;
            bVar6 = CodeWriterUtils::writeOffset(dst,(int64_t)zone,(OffsetFormat *)(psVar36 + 4));
            if (!bVar6) goto LAB_00118bc5;
            psVar13 = (size_t *)*psVar36;
            *psVar14 = (size_t)psVar13;
            *(size_t *)(pZVar30 + 0x140) = *(size_t *)(pZVar30 + 0x140) - 1;
            if (*(size_t *)(pZVar30 + 0x68) != 0) {
              pZVar28 = *(ZoneHashNode **)(pZVar30 + 0x78);
              *psVar36 = (size_t)pZVar28;
              *(size_t **)(pZVar30 + 0x78) = psVar36;
              goto LAB_00118bce;
            }
            goto LAB_00118c0e;
          }
LAB_00118bc5:
          psVar13 = (size_t *)*psVar36;
          pOVar25 = pOVar26;
          psVar14 = psVar36;
          format = pOVar26;
LAB_00118bce:
          psVar36 = psVar13;
        } while (psVar13 != (size_t *)0x0);
      }
      plStack_c0 = plStack_c0 + 1;
    } while (plStack_c0 != plStack_c8);
  }
  return (Error)format;
LAB_00118cb0:
  psVar13 = psVar14;
  uVar9 = *(uint *)((long)psVar13 + 0xc);
  if ((ulong)uVar9 != 0xffffffff) {
    if (uVar9 < *(uint *)(dst + 0x110)) {
      lVar20 = *(long *)(*(size_t *)(dst + 0x108) + (ulong)uVar9 * 8);
      plVar1 = (long *)(lVar20 + 0x20);
      *plVar1 = (long)(pZVar28 + *plVar1);
      *(uint *)(lVar20 + 0x14) = extraout_EDX;
LAB_00118cd8:
      psVar14 = (size_t *)*psVar13;
      *psVar36 = (size_t)psVar14;
      *(size_t *)(dst + 0x140) = *(size_t *)(dst + 0x140) - 1;
      if (*(size_t *)(dst + 0x68) != 0) {
        *psVar13 = *(size_t *)(dst + 0x78);
        *(size_t **)(dst + 0x78) = psVar13;
        psVar13 = psVar36;
        goto LAB_00118d56;
      }
      uStack_118 = 0x118d87;
      bindLabel();
    }
    uStack_118 = 0x118d8c;
    bindLabel();
LAB_00118d8c:
    uStack_118 = 0x118d91;
    bindLabel();
LAB_00118d91:
    uStack_118 = 0x118d96;
    bindLabel();
    return 0x13;
  }
  if ((uint)psVar13[1] == extraout_EDX) {
    uVar21 = psVar13[2];
    if (*(ulong *)(lStack_100 + 0x50) <= uVar21) goto LAB_00118d8c;
    if (*(ulong *)(lStack_100 + 0x50) - uVar21 < (ulong)*(byte *)((long)psVar13 + 0x22))
    goto LAB_00118d91;
    uStack_118 = 0x118d40;
    bVar37 = CodeWriterUtils::writeOffset
                       ((void *)(uVar21 + *(long *)(lStack_100 + 0x48)),
                        (int64_t)(pZVar28 + (psVar13[3] - uVar21)),(OffsetFormat *)(psVar13 + 4));
    if (bVar37) goto LAB_00118cd8;
    psVar14 = (size_t *)*psVar13;
    EStack_104 = 0x30;
  }
  else {
    psVar14 = (size_t *)*psVar13;
  }
LAB_00118d56:
  psVar36 = psVar13;
  if (psVar14 == (size_t *)0x0) {
    return EStack_104;
  }
  goto LAB_00118cb0;
LAB_00118e97:
  lVar33 = *(long *)(*(long *)(pZVar31 + 0xe8) + lVar20);
  uVar21 = *(ulong *)(lVar33 + 0x50);
  if (*(ulong *)(lVar33 + 0x50) < *(ulong *)(lVar33 + 0x18)) {
    uVar21 = *(ulong *)(lVar33 + 0x18);
  }
  if (uVar21 != 0) {
    pCVar32 = (CodeHolder *)
              (-(ulong)*(uint *)(lVar33 + 8) & (long)self_00 + ((ulong)*(uint *)(lVar33 + 8) - 1));
    if (pCVar32 < self_00) {
      uStack_158 = 0x118ef1;
      codeSize();
      if ((OffsetFormat)VVar19.constant == (OffsetFormat)0xffffffffffffffff) goto LAB_0011924f;
      self_00->_baseAddress = (uint64_t)VVar19;
      AStack_1b1 = (self_00->_environment)._arch;
      pSVar23 = self_00->_addressTableSection;
      VVar17 = VVar19;
      pCVar32 = self_00;
      pZStack_180 = zone;
      pCStack_178 = pCVar29;
      pOStack_170 = format;
      pZStack_168 = pZVar30;
      pZStack_160 = pZVar12;
      uStack_158 = uVar27;
      if (pSVar23 == (Section *)0x0) {
        puStack_198 = (uint8_t *)0x0;
      }
      else {
        cb = &pSVar23->_buffer;
        if ((pSVar23->_buffer)._capacity < pSVar23->_virtualSize) {
          uVar27 = 9;
          if (((pSVar23->_buffer)._flags & kIsFixed) != kNone) goto LAB_00119229;
          pcStack_1c0 = (code *)0x118f4e;
          VVar17 = (Value)cb;
          EVar8 = CodeHolder_reserveInternal(self_00,cb,pSVar23->_virtualSize);
          uVar27 = (ulong)EVar8;
          if (EVar8 != 0) goto LAB_00119229;
        }
        puStack_198 = cb->_data;
        pCVar29 = (CodeHolder *)cb;
      }
      uStack_1b0 = 0;
      pSStack_1a8 = pSVar23;
      VStack_1a0 = VVar19;
      if ((ulong)*(uint *)&self_00->field_0x110 == 0) goto LAB_001191ea;
      pSVar23 = (Section *)
                ((*(Value *)&self_00->_relocations)->valueType +
                (ulong)*(uint *)&self_00->field_0x110 * 8 + -1);
      uStack_188 = (ulong)(AStack_1b1 & k32BitMask) ^ 3;
      uStack_1b0 = 0;
      uVar27 = 0x17;
      VVar19.expression = *(Value *)&self_00->_relocations;
      goto LAB_00118fcd;
    }
    self_00 = (CodeHolder *)(&(pCVar32->_environment)._arch + uVar21);
    VVar19._0_1_ = (OffsetType)VVar19.constant | CARRY8((ulong)pCVar32,uVar21);
    VVar19.constant._1_7_ = 0;
  }
  lVar20 = lVar20 + 8;
  if ((ulong)*(uint *)(pZVar31 + 0xf0) << 3 == lVar20) {
    return -(uint)((OffsetType)VVar19.constant != kSignedOffset) | (uint)self_00;
  }
  goto LAB_00118e97;
LAB_00118fcd:
  do {
    format = *(OffsetFormat **)VVar19.expression;
    iVar10 = *(int *)&format->_valueOffset;
    if (iVar10 != 0) {
      uVar9._0_1_ = format[2]._type;
      uVar9._1_1_ = format[2]._flags;
      uVar9._2_1_ = format[2]._regionSize;
      uVar9._3_1_ = format[2]._valueSize;
      if (*(uint *)&self_00->field_0xe0 <= uVar9) {
        pcStack_1c0 = (code *)0x11924a;
        relocateToBase();
LAB_0011924a:
        pcStack_1c0 = (code *)0x11924f;
        relocateToBase();
LAB_0011924f:
        uVar27 = 2;
        goto LAB_00119229;
      }
      lVar20 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar9 * 8);
      uVar24._0_1_ = format[2]._valueOffset;
      uVar24._1_1_ = format[2]._immBitCount;
      uVar24._2_1_ = format[2]._immBitShift;
      uVar24._3_1_ = format[2]._immDiscardLsb;
      if ((ulong)uVar24 == 0xffffffff) {
        lVar33 = 0;
      }
      else {
        if (*(uint *)&self_00->field_0xe0 <= uVar24) goto LAB_0011924a;
        lVar33 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar24 * 8);
      }
      self = (Value)((Value *)(format + 4))->expression;
      OVar2 = format[3];
      if ((((ulong)*(OffsetFormat *)(lVar20 + 0x50) <= (ulong)OVar2) ||
          (pCVar32 = (CodeHolder *)(ulong)format[1]._regionSize,
          (CodeHolder *)((long)*(OffsetFormat *)(lVar20 + 0x50) - (long)OVar2) < pCVar32)) ||
         (4 < iVar10 - 1U)) goto LAB_00119229;
      lVar3 = *(long *)(lVar20 + 0x10);
      pCVar29 = *(CodeHolder **)(lVar20 + 0x48);
      VVar17 = self;
      VStack_190 = self;
      switch(iVar10) {
      case 1:
        pcStack_1c0 = (code *)0x119072;
        EVar8 = CodeHolder_evaluateExpression
                          ((CodeHolder *)self.expression,(Expression *)&VStack_190,
                           (uint64_t *)&switchD_00119063::switchdataD_0014c3c0);
        VVar17 = VStack_190;
        if (EVar8 != 0) {
          uVar27 = (ulong)EVar8;
          goto LAB_00119229;
        }
        break;
      case 3:
        if (lVar33 == 0) goto LAB_00119229;
        VVar17.expression =
             (Expression *)
             ((self.expression)->valueType + (long)(VStack_1a0.constant - 1) +
             *(long *)(lVar33 + 0x10));
        break;
      case 4:
        VVar17.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_1a0.expression)->valueType + (long)pCVar32 + lVar3 + (long)OVar2 + -1));
        if ((AStack_1b1 & k32BitMask) == kUnknown) {
          if ((long)(int)VVar17.constant != VVar17.constant) {
LAB_0011923e:
            uVar27 = 0x18;
            goto LAB_00119229;
          }
        }
        else {
          VVar17 = (Value)(long)(int)VVar17.constant;
        }
        break;
      case 5:
        if ((format[1]._valueSize != '\x04') ||
           (uVar21 = (ulong)format[1]._valueOffset + (long)OVar2, uVar21 < 2)) goto LAB_00119229;
        VVar17.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_1a0.expression)->valueType + (long)pCVar32 + lVar3 + (long)OVar2 + -1));
        if ((long)(int)VVar17.constant != VVar17.constant) {
          uVar18 = *(ulong *)&self_00->_addressTableEntries;
          while( true ) {
            if (uVar18 == 0) goto LAB_00119229;
            OVar4 = *(OffsetFormat *)(uVar18 + 0x10);
            uVar9 = (uint)((ulong)OVar4 >= self.constant && OVar4 != (OffsetFormat)self.constant) -
                    (uint)((ulong)OVar4 < self.constant);
            if (uVar9 == 0) break;
            uVar18 = *(ulong *)(uVar18 + (ulong)(uVar9 >> 0x1f) * 8) & 0xfffffffffffffffe;
          }
          if (pSStack_1a8 == (Section *)0x0) goto LAB_00119260;
          uVar9 = *(uint *)(uVar18 + 0x18);
          if (uVar9 == 0xffffffff) {
            uVar9 = (uint)uStack_1b0;
            *(uint *)(uVar18 + 0x18) = uVar9;
            uStack_1b0 = (ulong)(uVar9 + 1);
          }
          lVar20 = (ulong)uVar9 << ((byte)uStack_188 & 0x3f);
          VVar17.expression =
               (Expression *)
               (pSStack_1a8->_offset +
               (lVar20 - (long)(&(pCVar32->_environment)._arch + (long)OVar2 + lVar3)));
          if ((long)(int)VVar17.constant != VVar17.constant) goto LAB_0011923e;
          uVar7 = 0x15;
          if ((&pCVar29[-1].field_0x157)[uVar21] != -0x18) {
            if ((&pCVar29[-1].field_0x157)[uVar21] != -0x17) goto LAB_00119229;
            uVar7 = 0x25;
          }
          (&pCVar29[-1].field_0x156)[uVar21] = 0xff;
          (&pCVar29[-1].field_0x157)[uVar21] = uVar7;
          *(OffsetFormat *)(puStack_198 + lVar20) = format[4];
        }
      }
      pCVar29 = (CodeHolder *)(&(pCVar29->_environment)._arch + (long)format[3]);
      format = format + 1;
      pcStack_1c0 = (code *)0x1191d9;
      pCVar32 = pCVar29;
      bVar37 = CodeWriterUtils::writeOffset(pCVar29,VVar17.constant,format);
      if (!bVar37) goto LAB_00119229;
    }
    VVar19.expression = (Expression *)(VVar19.expression)->value;
  } while ((Section *)VVar19.constant != pSVar23);
LAB_001191ea:
  if (*(int *)&self_00->field_0xf0 == 0) {
    pcStack_1c0 = (code *)0x11925b;
    relocateToBase();
    self = VVar17;
  }
  else {
    uVar27 = 0;
    if (*(Section **)
         (*(long *)&self_00->_sectionsByOrder + (ulong)(*(int *)&self_00->field_0xf0 - 1) * 8) !=
        pSStack_1a8) {
LAB_00119229:
      return (Error)uVar27;
    }
    self = VVar17;
    if (pSStack_1a8 != (Section *)0x0) {
      uVar21 = (ulong)(uint)((int)uStack_1b0 << (AStack_1b1 & k32BitMask ^ kRISCV32));
      (pSStack_1a8->_buffer)._size = uVar21;
      pSStack_1a8->_virtualSize = uVar21;
      goto LAB_00119229;
    }
  }
  pcStack_1c0 = (code *)0x119260;
  relocateToBase();
LAB_00119260:
  pcStack_1c0 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar20 = 0;
  pVVar35 = aVStack_210;
  bVar37 = true;
  VStack_200 = self;
  pSStack_1e8 = pSVar23;
  pCStack_1e0 = pCVar29;
  pOStack_1d8 = format;
  pCStack_1d0 = self_00;
  VStack_1c8 = VVar19;
  pcStack_1c0 = (code *)uVar27;
  do {
    bVar6 = bVar37;
    VVar17.constant._1_7_ = 0;
    VVar17.constant._0_1_ = (&(pCVar32->_environment)._subArch)[lVar20];
    if (3 < VVar17.constant) {
      return 3;
    }
    switch(VVar17.constant) {
    case 1:
      VVar17 = *(Value *)(&pCVar32->_cpuFeatures + lVar20 * 8);
      break;
    case 2:
      lVar33 = *(long *)(*(long *)(&pCVar32->_cpuFeatures + lVar20 * 8) + 0x20);
      if (lVar33 == 0) {
        return 0x43;
      }
      VVar17.expression =
           (Expression *)
           (*(long *)(*(long *)(&pCVar32->_cpuFeatures + lVar20 * 8) + 0x18) +
           *(long *)(lVar33 + 0x10));
      break;
    case 3:
      EVar8 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&pCVar32->_cpuFeatures + lVar20 * 8),
                         (Expression *)&VStack_1f0,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[VVar17.constant]));
      VVar17 = VStack_1f0;
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    pVVar35->constant = (uint64_t)VVar17;
    lVar20 = 1;
    pVVar35 = &VStack_1f8;
    bVar37 = false;
  } while (bVar6);
  switch((pCVar32->_environment)._arch) {
  case kUnknown:
    pEVar16 = (VStack_1f8.expression)->valueType + (aVStack_210[0].constant - 1);
    break;
  case k32BitMask:
    pEVar16 = (ExpressionValueType *)((long)aVStack_210[0].expression - (long)VStack_1f8);
    break;
  case kHost:
    pEVar16 = (ExpressionValueType *)(VStack_1f8.constant * aVStack_210[0].constant);
    break;
  case kRISCV32:
    pEVar22 = (ExpressionValueType *)(aVStack_210[0].constant << ((byte)VStack_1f8.constant & 0x3f))
    ;
    goto LAB_00119352;
  case kRISCV64:
    pEVar22 = (ExpressionValueType *)(aVStack_210[0].constant >> ((byte)VStack_1f8.constant & 0x3f))
    ;
LAB_00119352:
    pEVar16 = (ExpressionValueType *)0x0;
    if (VStack_1f8.constant < 0x40) {
      pEVar16 = pEVar22;
    }
    break;
  case kARM:
    VVar19.constant = 0x3f;
    if (VStack_1f8.constant < 0x3f) {
      VVar19 = VStack_1f8;
    }
    pEVar16 = (ExpressionValueType *)
              ((long)aVStack_210[0].constant >> ((byte)VVar19.constant & 0x3f));
    break;
  default:
    return 3;
  }
  *(ExpressionValueType **)VStack_200.expression = pEVar16;
  return 0;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}